

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  StringRef reporterSpec_00;
  bool bVar1;
  ColourMode CVar2;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pOVar3
  ;
  string *psVar4;
  Optional<Catch::ColourMode> *this_00;
  long in_RSI;
  IConfig *in_RDI;
  ReporterSpec *reporterSpec;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_> *__range1_2;
  bool defaultOutputUsed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *testOrTags;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  TestSpecParser parser;
  Optional<Catch::ReporterSpec> parsed;
  char *default_spec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  value_type *in_stack_fffffffffffffb78;
  TestSpecParser *in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  StringRef *in_stack_fffffffffffffb90;
  ColourMode *pCVar5;
  string *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  ConfigData *in_stack_fffffffffffffbc0;
  string *this_01;
  string local_3a0 [32];
  string local_380 [32];
  ColourMode local_360 [8];
  undefined1 local_358 [104];
  ReporterSpec *local_2f0;
  __normal_iterator<Catch::ReporterSpec_*,_std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>_>
  local_2e8;
  _Base_ptr local_2e0;
  byte local_2d1;
  reference local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_290;
  IConfig *local_288;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  size_type in_stack_fffffffffffffe88;
  Optional<Catch::ReporterSpec> local_138;
  char *local_a8;
  string local_a0 [32];
  reference local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  IConfig *local_68;
  string local_60 [32];
  Config *in_stack_ffffffffffffffc0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  IConfig *local_28;
  long local_10;
  
  local_10 = in_RSI;
  IConfig::IConfig(in_RDI);
  in_RDI->_vptr_IConfig = (_func_int **)&PTR__Config_002a6038;
  ConfigData::ConfigData
            (in_stack_fffffffffffffbc0,
             (ConfigData *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
  std::vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>::vector
            ((vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_> *)
             0x177475);
  TestSpec::TestSpec((TestSpec *)in_stack_fffffffffffffb80);
  *(undefined1 *)&in_RDI[0x2c]._vptr_IConfig = 0;
  local_28 = in_RDI + 0x1d;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffb78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb80,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb78), bVar1) {
    in_stack_ffffffffffffffc0 =
         (Config *)
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&local_30);
    trim(in_stack_fffffffffffffb98);
    std::__cxx11::string::operator=((string *)in_stack_ffffffffffffffc0,local_60);
    std::__cxx11::string::~string(local_60);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  }
  local_68 = in_RDI + 0x20;
  local_70._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb78);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb80,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb78), bVar1) {
    local_80 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_70);
    trim(in_stack_fffffffffffffb98);
    std::__cxx11::string::operator=((string *)local_80,local_a0);
    std::__cxx11::string::~string(local_a0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_70);
  }
  bVar1 = std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::empty
                    ((vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_> *)
                     in_stack_fffffffffffffb90);
  if (bVar1) {
    local_a8 = "console";
    StringRef::StringRef
              (in_stack_fffffffffffffb90,
               (char *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
    reporterSpec_00.m_start._7_1_ = in_stack_fffffffffffffe87;
    reporterSpec_00.m_start._0_7_ = in_stack_fffffffffffffe80;
    reporterSpec_00.m_size = in_stack_fffffffffffffe88;
    parseReporterSpec(reporterSpec_00);
    bVar1 = Optional<Catch::ReporterSpec>::operator!(&local_138);
    if (bVar1) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffb80);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffb80,
                 (char (*) [51])in_stack_fffffffffffffb78);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffb80,
                 (char **)in_stack_fffffffffffffb78);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78
                );
      ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffb78);
      throw_domain_error(in_stack_fffffffffffffba0);
    }
    Optional<Catch::ReporterSpec>::operator*(&local_138);
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::push_back
              ((vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_> *)
               in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    Optional<Catch::ReporterSpec>::~Optional((Optional<Catch::ReporterSpec> *)0x177816);
  }
  bVar1 = anon_unknown_26::enableBazelEnvSupport();
  if (bVar1) {
    readBazelEnvVars(in_stack_ffffffffffffffc0);
  }
  ITagAliasRegistry::get();
  TestSpecParser::TestSpecParser
            (in_stack_fffffffffffffb80,(ITagAliasRegistry *)in_stack_fffffffffffffb78);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb90);
  if (!bVar1) {
    *(undefined1 *)&in_RDI[0x2c]._vptr_IConfig = 1;
    local_288 = in_RDI + 0x1d;
    local_290._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb78);
    local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffb80,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffb78), bVar1) {
      local_2a0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_290);
      TestSpecParser::parse
                ((TestSpecParser *)in_stack_fffffffffffffbc0,
                 (string *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_290);
    }
  }
  TestSpecParser::testSpec
            ((TestSpecParser *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
  TestSpec::operator=((TestSpec *)in_stack_fffffffffffffb80,(TestSpec *)in_stack_fffffffffffffb78);
  TestSpec::~TestSpec((TestSpec *)in_stack_fffffffffffffb80);
  local_2d1 = 0;
  local_2e0 = (_Base_ptr)(in_RDI + 0x1a);
  local_2e8._M_current =
       (ReporterSpec *)
       std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::begin
                 ((vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_> *)
                  in_stack_fffffffffffffb78);
  local_2f0 = (ReporterSpec *)
              std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::end
                        ((vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_> *)
                         in_stack_fffffffffffffb78);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Catch::ReporterSpec_*,_std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>_>
                        *)in_stack_fffffffffffffb80,
                       (__normal_iterator<Catch::ReporterSpec_*,_std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>_>
                        *)in_stack_fffffffffffffb78);
    if (!bVar1) {
      TestSpecParser::~TestSpecParser(in_stack_fffffffffffffb80);
      return;
    }
    local_358._96_8_ =
         __gnu_cxx::
         __normal_iterator<Catch::ReporterSpec_*,_std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>_>
         ::operator*(&local_2e8);
    pOVar3 = ReporterSpec::outputFile_abi_cxx11_((ReporterSpec *)local_358._96_8_);
    bVar1 = Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::none(pOVar3);
    if (bVar1) {
      if ((local_2d1 & 1) != 0) {
        ReusableStringStream::ReusableStringStream
                  ((ReusableStringStream *)in_stack_fffffffffffffb80);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffb80,
                   (char (*) [65])in_stack_fffffffffffffb78);
        ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffb78);
        throw_domain_error(in_stack_fffffffffffffba0);
      }
      local_2d1 = 1;
    }
    psVar4 = ReporterSpec::name_abi_cxx11_((ReporterSpec *)local_358._96_8_);
    std::__cxx11::string::string(local_3a0,(string *)psVar4);
    this_01 = local_380;
    ReporterSpec::outputFile_abi_cxx11_((ReporterSpec *)local_358._96_8_);
    bVar1 = Catch::Optional::operator_cast_to_bool
                      ((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x177b72);
    if (bVar1) {
      pOVar3 = ReporterSpec::outputFile_abi_cxx11_((ReporterSpec *)local_358._96_8_);
      in_stack_fffffffffffffba0 =
           Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(pOVar3);
    }
    else {
      in_stack_fffffffffffffba0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_10 + 0x68);
    }
    std::__cxx11::string::string(this_01,(string *)in_stack_fffffffffffffba0);
    pCVar5 = local_360;
    this_00 = ReporterSpec::colourMode((ReporterSpec *)local_358._96_8_);
    CVar2 = Optional<Catch::ColourMode>::valueOr(this_00,(ColourMode *)(local_10 + 0x5c));
    *pCVar5 = CVar2;
    in_stack_fffffffffffffb78 = (value_type *)local_358;
    in_stack_fffffffffffffb80 =
         (TestSpecParser *)ReporterSpec::customOptions_abi_cxx11_((ReporterSpec *)local_358._96_8_);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)in_stack_fffffffffffffb80,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)in_stack_fffffffffffffb78);
    std::vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>::
    push_back((vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_> *
              )in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
    ProcessedReporterSpec::~ProcessedReporterSpec
              ((ProcessedReporterSpec *)in_stack_fffffffffffffb80);
    __gnu_cxx::
    __normal_iterator<Catch::ReporterSpec_*,_std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>_>
    ::operator++(&local_2e8);
  } while( true );
}

Assistant:

Config::Config( ConfigData const& data ):
        m_data( data ) {
        // We need to trim filter specs to avoid trouble with superfluous
        // whitespace (esp. important for bdd macros, as those are manually
        // aligned with whitespace).

        for (auto& elem : m_data.testsOrTags) {
            elem = trim(elem);
        }
        for (auto& elem : m_data.sectionsToRun) {
            elem = trim(elem);
        }

        // Insert the default reporter if user hasn't asked for a specific one
        if ( m_data.reporterSpecifications.empty() ) {
#if defined( CATCH_CONFIG_DEFAULT_REPORTER )
            const auto default_spec = CATCH_CONFIG_DEFAULT_REPORTER;
#else
            const auto default_spec = "console";
#endif
            auto parsed = parseReporterSpec(default_spec);
            CATCH_ENFORCE( parsed,
                           "Cannot parse the provided default reporter spec: '"
                               << default_spec << '\'' );
            m_data.reporterSpecifications.push_back( std::move( *parsed ) );
        }

        if ( enableBazelEnvSupport() ) {
            readBazelEnvVars();
        }

        // Bazel support can modify the test specs, so parsing has to happen
        // after reading Bazel env vars.
        TestSpecParser parser( ITagAliasRegistry::get() );
        if ( !m_data.testsOrTags.empty() ) {
            m_hasTestFilters = true;
            for ( auto const& testOrTags : m_data.testsOrTags ) {
                parser.parse( testOrTags );
            }
        }
        m_testSpec = parser.testSpec();


        // We now fixup the reporter specs to handle default output spec,
        // default colour spec, etc
        bool defaultOutputUsed = false;
        for ( auto const& reporterSpec : m_data.reporterSpecifications ) {
            // We do the default-output check separately, while always
            // using the default output below to make the code simpler
            // and avoid superfluous copies.
            if ( reporterSpec.outputFile().none() ) {
                CATCH_ENFORCE( !defaultOutputUsed,
                               "Internal error: cannot use default output for "
                               "multiple reporters" );
                defaultOutputUsed = true;
            }

            m_processedReporterSpecs.push_back( ProcessedReporterSpec{
                reporterSpec.name(),
                reporterSpec.outputFile() ? *reporterSpec.outputFile()
                                          : data.defaultOutputFilename,
                reporterSpec.colourMode().valueOr( data.defaultColourMode ),
                reporterSpec.customOptions() } );
        }
    }